

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFunctionalTests.cpp
# Opt level: O2

int __thiscall
deqp::gles2::Functional::NegativeApiTestGroup::init(NegativeApiTestGroup *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  TestNode *pTVar1;
  
  pTVar1 = (TestNode *)operator_new(0x78);
  NegativeBufferApiTests::NegativeBufferApiTests
            ((NegativeBufferApiTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  NegativeFragmentApiTests::NegativeFragmentApiTests
            ((NegativeFragmentApiTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  NegativeShaderApiTests::NegativeShaderApiTests
            ((NegativeShaderApiTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  NegativeStateApiTests::NegativeStateApiTests
            ((NegativeStateApiTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  NegativeTextureApiTests::NegativeTextureApiTests
            ((NegativeTextureApiTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  NegativeVertexArrayApiTests::NegativeVertexArrayApiTests
            ((NegativeVertexArrayApiTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  return extraout_EAX;
}

Assistant:

virtual void init (void)
	{
		addChild(new NegativeBufferApiTests			(m_context));
		addChild(new NegativeFragmentApiTests		(m_context));
		addChild(new NegativeShaderApiTests			(m_context));
		addChild(new NegativeStateApiTests			(m_context));
		addChild(new NegativeTextureApiTests		(m_context));
		addChild(new NegativeVertexArrayApiTests	(m_context));
	}